

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O0

int64_t highbd_get_sse_shift
                  (uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height,
                  uint input_shift)

{
  long lVar1;
  int64_t diff;
  int y;
  int x;
  int64_t total_sse;
  uint16_t *b;
  uint16_t *a;
  int height_local;
  int width_local;
  int b_stride_local;
  uint8_t *b8_local;
  int a_stride_local;
  uint8_t *a8_local;
  
  a = (uint16_t *)((long)a8 << 1);
  b = (uint16_t *)((long)b8 << 1);
  total_sse = 0;
  for (y = 0; y < height; y = y + 1) {
    for (x = 0; x < width; x = x + 1) {
      lVar1 = (long)(((int)(uint)a[x] >> ((byte)input_shift & 0x1f)) -
                    ((int)(uint)b[x] >> ((byte)input_shift & 0x1f)));
      total_sse = lVar1 * lVar1 + total_sse;
    }
    a = a + a_stride;
    b = b + b_stride;
  }
  return total_sse;
}

Assistant:

static int64_t highbd_get_sse_shift(const uint8_t *a8, int a_stride,
                                    const uint8_t *b8, int b_stride, int width,
                                    int height, unsigned int input_shift) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t total_sse = 0;
  int x, y;
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      int64_t diff;
      diff = (a[x] >> input_shift) - (b[x] >> input_shift);
      total_sse += diff * diff;
    }
    a += a_stride;
    b += b_stride;
  }
  return total_sse;
}